

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O2

bool __thiscall cmCPackDebGenerator::createDebPackages(cmCPackDebGenerator *this)

{
  bool bVar1;
  bool bVar2;
  string *path;
  cmValue path_00;
  anon_class_8_1_8991fb9c make_package;
  allocator<char> local_41;
  string local_40;
  anon_class_8_1_8991fb9c local_20;
  
  local_20.this = this;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"GEN_WDIR",&local_41);
  path = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_40);
  if (path == (string *)0x0) {
    path = &cmValue::Empty_abi_cxx11_;
  }
  bVar1 = createDebPackages::anon_class_8_1_8991fb9c::operator()
                    (&local_20,path,"GEN_CPACK_OUTPUT_FILE_NAME",0x17d96a);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"GEN_DBGSYMDIR",&local_41);
  path_00 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"GEN_CPACK_DEBIAN_DEBUGINFO_PACKAGE",&local_41);
  bVar2 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_40);
  if (bVar2) {
    std::__cxx11::string::~string((string *)&local_40);
    if (path_00.Value != (string *)0x0) {
      bVar2 = createDebPackages::anon_class_8_1_8991fb9c::operator()
                        (&local_20,path_00.Value,"GEN_CPACK_DBGSYM_OUTPUT_FILE_NAME",0x17ee1a);
      bVar1 = bVar1 && bVar2;
    }
  }
  else {
    std::__cxx11::string::~string((string *)&local_40);
  }
  return bVar1;
}

Assistant:

bool cmCPackDebGenerator::createDebPackages()
{
  auto make_package = [this](const std::string& path,
                             const char* const output_var,
                             bool (cmCPackDebGenerator::*creator)()) -> bool {
    try {
      this->packageFiles = findFilesIn(path);
    } catch (const std::runtime_error& ex) {
      cmCPackLogger(cmCPackLog::LOG_ERROR, ex.what() << std::endl);
      return false;
    }

    if ((this->*creator)()) {
      // add the generated package to package file names list
      this->packageFileNames.emplace_back(
        cmStrCat(this->GetOption("CPACK_TOPLEVEL_DIRECTORY"), '/',
                 this->GetOption(output_var)));
      return true;
    }
    return false;
  };
  bool retval =
    make_package(this->GetOption("GEN_WDIR"), "GEN_CPACK_OUTPUT_FILE_NAME",
                 &cmCPackDebGenerator::createDeb);
  cmValue dbgsymdir_path = this->GetOption("GEN_DBGSYMDIR");
  if (this->IsOn("GEN_CPACK_DEBIAN_DEBUGINFO_PACKAGE") && dbgsymdir_path) {
    retval = make_package(dbgsymdir_path, "GEN_CPACK_DBGSYM_OUTPUT_FILE_NAME",
                          &cmCPackDebGenerator::createDbgsymDDeb) &&
      retval;
  }
  return static_cast<int>(retval);
}